

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# validate_image.cpp
# Opt level: O3

spv_result_t
spvtools::val::anon_unknown_0::ValidateImageOperands
          (ValidationState_t *_,Instruction *inst,ImageTypeInfo *info,uint32_t word_index)

{
  ushort uVar1;
  pointer puVar2;
  Op opcode;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  uint32_t uVar8;
  uint32_t uVar9;
  uint32_t uVar10;
  Op OVar11;
  int32_t iVar12;
  spv_result_t sVar13;
  ulong uVar14;
  Instruction *pIVar15;
  DiagnosticStream *pDVar16;
  uint uVar17;
  ulong uVar18;
  uint uVar19;
  long lVar20;
  char *pcVar21;
  string *val;
  uint uVar22;
  uint64_t array_size;
  string local_238;
  undefined1 local_218 [16];
  DiagnosticStream local_208;
  
  if ((anonymous_namespace)::
      ValidateImageOperands(spvtools::val::ValidationState_t&,spvtools::val::Instruction_const*,spvtools::val::(anonymous_namespace)::ImageTypeInfo_const&,unsigned_int)
      ::kAllImageOperandsHandled == '\0') {
    _GLOBAL__N_1::ValidateImageOperands();
  }
  uVar1 = (inst->inst_).opcode;
  puVar2 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_start;
  uVar14 = (long)(inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                 _M_impl.super__Vector_impl_data._M_finish - (long)puVar2 >> 2;
  uVar18 = (ulong)(word_index - 1);
  if (uVar18 < uVar14) {
    uVar22 = puVar2[uVar18];
    uVar18 = 0;
    uVar19 = uVar22 & 0xffff83ff;
    if (uVar19 != 0) {
      do {
        uVar17 = (int)uVar18 + 1;
        uVar18 = (ulong)uVar17;
        uVar19 = uVar19 - 1 & uVar19;
      } while (uVar19 != 0);
      uVar18 = (ulong)uVar17;
    }
    if (uVar18 + ((uVar22 >> 2 & 1) != 0) == uVar14 - word_index) goto LAB_001e78e9;
LAB_001e78bb:
    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
    pcVar21 = "Number of image operand ids doesn\'t correspond to the bit mask";
LAB_001e78da:
    lVar20 = 0x3e;
  }
  else {
    uVar22 = 0;
    if (uVar14 != uVar18) goto LAB_001e78bb;
LAB_001e78e9:
    if ((info->multisampled & ((uVar22 & 0x40) >> 6 ^ 1)) == 0) {
      if (uVar22 == 0) {
        return SPV_SUCCESS;
      }
      uVar19 = uVar22 & 0x10038;
      if (uVar19 != 0) {
        uVar17 = 0;
        do {
          uVar17 = uVar17 + 1;
          uVar19 = uVar19 - 1 & uVar19;
        } while (uVar19 != 0);
        if (1 < uVar17) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar21 = 
          "Image Operands Offset, ConstOffset, ConstOffsets, Offsets cannot be used together";
          lVar20 = 0x51;
          goto LAB_001e7921;
        }
      }
      bVar3 = IsImplicitLod((uint)uVar1);
      bVar4 = IsExplicitLod((uint)uVar1);
      if ((uVar1 - 0x62 < 2) || (bVar5 = bVar4, uVar1 == 0x140)) {
        bVar5 = EnumSet<spv::Capability>::contains
                          (&_->module_capabilities_,CapabilityImageReadWriteLodAMD);
      }
      if ((uVar1 == 0x13a) || (uVar1 == 0x60)) {
        bVar6 = EnumSet<spv::Capability>::contains
                          (&_->module_capabilities_,CapabilityImageGatherBiasLodAMD);
      }
      else {
        bVar6 = false;
      }
      if ((uVar22 & 1) == 0) {
LAB_001e7a16:
        opcode = (Op)uVar1;
        if ((uVar22 & 2) == 0) {
          if ((uVar22 & 4) == 0) {
            bVar4 = false;
LAB_001e7c7a:
            if ((uVar22 & 8) == 0) {
LAB_001e7c84:
              if ((uVar22 & 0x10) != 0) {
                if (info->dim == Cube) {
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar21 = "Image Operand Offset cannot be used with Cube Image \'Dim\'";
                  lVar20 = 0x39;
                  goto LAB_001e7921;
                }
                uVar9 = ValidationState_t::GetTypeId
                                  (_,(inst->words_).
                                     super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                     ._M_impl.super__Vector_impl_data._M_start[word_index]);
                bVar5 = ValidationState_t::IsIntScalarOrVectorType(_,uVar9);
                if (!bVar5) {
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar21 = "Expected Image Operand Offset to be int scalar or ";
                  lVar20 = 0x32;
                  goto LAB_001e80af;
                }
                uVar10 = GetPlaneCoordSize((ImageTypeInfo *)(ulong)info->dim);
                uVar9 = ValidationState_t::GetDimension(_,uVar9);
                if (uVar10 != uVar9) {
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar21 = "Expected Image Operand Offset to have ";
                  lVar20 = 0x26;
                  goto LAB_001e83c1;
                }
                word_index = word_index + 1;
                if (((_->options_->before_hlsl_legalization == false) &&
                    (bVar5 = spvIsVulkanEnv(_->context_->target_env), bVar5)) &&
                   ((1 < opcode - OpImageGather && (1 < opcode - OpImageSparseGather)))) {
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  ValidationState_t::VkErrorID_abi_cxx11_(&local_238,_,0x1237,(char *)0x0);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,local_238._M_dataplus._M_p,
                             local_238._M_string_length);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,
                             "Image Operand Offset can only be used with OpImage*Gather operations",
                             0x44);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_238._M_dataplus._M_p != &local_238.field_2) {
                    operator_delete(local_238._M_dataplus._M_p,
                                    local_238.field_2._M_allocated_capacity + 1);
                  }
                  goto LAB_001e7933;
                }
              }
              if ((uVar22 & 0x20) == 0) {
LAB_001e7c98:
                uVar19 = (uint)uVar1;
                if ((uVar22 & 0x40) == 0) {
LAB_001e7cfc:
                  if (-1 < (char)uVar22) {
LAB_001e7d05:
                    if ((uVar22 >> 8 & 1) == 0) {
LAB_001e7d10:
                      OVar11 = (Op)uVar1;
                      if ((uVar22 >> 9 & 1) == 0) {
                        return SPV_SUCCESS;
                      }
                      if ((OVar11 != OpImageRead) && (OVar11 != OpImageSparseRead)) {
                        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)&local_208,
                                   "Image Operand MakeTexelVisibleKHR can only be used with Op",0x3a
                                  );
                        local_238._M_dataplus._M_p = spvOpcodeString(OpImageRead);
                        pDVar16 = DiagnosticStream::operator<<(&local_208,(char **)&local_238);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)pDVar16," or Op",6);
                        local_218._0_8_ = spvOpcodeString(OpImageSparseRead);
                        pDVar16 = DiagnosticStream::operator<<(pDVar16,(char **)local_218);
                        std::__ostream_insert<char,std::char_traits<char>>
                                  ((ostream *)pDVar16,": Op",4);
                        pcVar21 = spvOpcodeString(OVar11);
                        val = (string *)(local_218 + 8);
                        goto LAB_001e8708;
                      }
                      if ((uVar22 >> 10 & 1) != 0) {
                        sVar13 = ValidateMemoryScope(_,inst,(inst->words_).
                                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [word_index]);
                        if (sVar13 == SPV_SUCCESS) {
                          return SPV_SUCCESS;
                        }
                        return sVar13;
                      }
                      pDVar16 = &local_208;
                      ValidationState_t::diag(pDVar16,_,SPV_ERROR_INVALID_DATA,inst);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar16,
                                 "Image Operand MakeTexelVisibleKHR requires NonPrivateTexelKHR is also specified: Op"
                                 ,0x53);
                      local_238._M_dataplus._M_p = spvOpcodeString(opcode);
                      val = &local_238;
                    }
                    else {
                      if (uVar1 == OpImageWrite) {
                        if ((uVar22 >> 10 & 1) == 0) {
                          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                          std::__ostream_insert<char,std::char_traits<char>>
                                    ((ostream *)&local_208,
                                     "Image Operand MakeTexelAvailableKHR requires NonPrivateTexelKHR is also specified: Op"
                                     ,0x55);
                          local_238._M_dataplus._M_p = spvOpcodeString(OpImageWrite);
                          pDVar16 = DiagnosticStream::operator<<(&local_208,(char **)&local_238);
                          local_208.error_ = pDVar16->error_;
                          goto LAB_001e7933;
                        }
                        sVar13 = ValidateMemoryScope(_,inst,(inst->words_).
                                                                                                                        
                                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                                  ._M_impl.super__Vector_impl_data._M_start
                                                  [word_index]);
                        if (sVar13 != SPV_SUCCESS) {
                          return sVar13;
                        }
                        word_index = word_index + 1;
                        goto LAB_001e7d10;
                      }
                      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)&local_208,
                                 "Image Operand MakeTexelAvailableKHR can only be used with Op",0x3c
                                );
                      local_238._M_dataplus._M_p = spvOpcodeString(OpImageWrite);
                      pDVar16 = DiagnosticStream::operator<<(&local_208,(char **)&local_238);
                      std::__ostream_insert<char,std::char_traits<char>>
                                ((ostream *)pDVar16,": Op",4);
                      pcVar21 = spvOpcodeString((uint)uVar1);
                      val = (string *)local_218;
LAB_001e8708:
                      (val->_M_dataplus)._M_p = pcVar21;
                    }
                    pDVar16 = DiagnosticStream::operator<<(pDVar16,(char **)val);
                    local_208.error_ = pDVar16->error_;
                    goto LAB_001e7933;
                  }
                  if (bVar4 || bVar3) {
                    uVar9 = ValidationState_t::GetTypeId
                                      (_,(inst->words_).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start[word_index]);
                    bVar3 = ValidationState_t::IsFloatScalarType(_,uVar9);
                    if (bVar3) {
                      if (info->dim < Rect) {
                        if (info->multisampled == 0) {
                          word_index = word_index + 1;
                          goto LAB_001e7d05;
                        }
                        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                        pcVar21 = "Image Operand MinLod requires \'MS\' parameter to be 0";
                        lVar20 = 0x34;
                      }
                      else {
                        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                        pcVar21 = 
                        "Image Operand MinLod requires \'Dim\' parameter to be 1D, 2D, 3D or Cube";
                        lVar20 = 0x46;
                      }
                    }
                    else {
                      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                      pcVar21 = "Expected Image Operand MinLod to be float scalar";
                      lVar20 = 0x30;
                    }
                  }
                  else {
                    ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                    std::__ostream_insert<char,std::char_traits<char>>
                              ((ostream *)&local_208,
                               "Image Operand MinLod can only be used with ImplicitLod ",0x37);
                    pcVar21 = "opcodes or together with Image Operand Grad";
                    lVar20 = 0x2b;
                  }
                }
                else if ((((uVar19 - 0x5f < 5) && ((0x19U >> (uVar19 - 0x5f & 0x1f) & 1) != 0)) ||
                         (uVar19 == 0x139)) || (uVar19 == 0x140)) {
                  if (info->multisampled != 0) {
                    uVar9 = ValidationState_t::GetTypeId
                                      (_,(inst->words_).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start[word_index]);
                    bVar5 = ValidationState_t::IsIntScalarType(_,uVar9);
                    if (!bVar5) {
                      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                      pcVar21 = "Expected Image Operand Sample to be int scalar";
                      goto LAB_001e7c25;
                    }
                    word_index = word_index + 1;
                    goto LAB_001e7cfc;
                  }
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar21 = "Image Operand Sample requires non-zero \'MS\' parameter";
                  lVar20 = 0x35;
                }
                else {
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,
                             "Image Operand Sample can only be used with OpImageFetch, ",0x39);
                  std::__ostream_insert<char,std::char_traits<char>>
                            ((ostream *)&local_208,
                             "OpImageRead, OpImageWrite, OpImageSparseFetch and ",0x32);
                  pcVar21 = "OpImageSparseRead";
                  lVar20 = 0x11;
                }
              }
              else if ((uVar1 - 0x60 < 2) || (uVar1 - 0x13a < 2)) {
                if (info->dim != Cube) {
                  uVar9 = (inst->words_).
                          super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                          super__Vector_impl_data._M_start[word_index];
                  uVar10 = ValidationState_t::GetTypeId(_,uVar9);
                  pIVar15 = ValidationState_t::FindDef(_,uVar10);
                  if (pIVar15 == (Instruction *)0x0) {
                    __assert_fail("type_inst",
                                  "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_image.cpp"
                                  ,0x1ea,
                                  "spv_result_t spvtools::val::(anonymous namespace)::ValidateImageOperands(ValidationState_t &, const Instruction *, const ImageTypeInfo &, uint32_t)"
                                 );
                  }
                  if ((pIVar15->inst_).opcode == 0x1c) {
                    local_238._M_dataplus._M_p = (char *)0x0;
                    bVar5 = ValidationState_t::EvalConstantValUint64
                                      (_,(pIVar15->words_).
                                         super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>
                                         ._M_impl.super__Vector_impl_data._M_start[3],
                                       (uint64_t *)&local_238);
                    if (!bVar5) {
                      __assert_fail("0 && \"Array type definition is corrupt\"",
                                    "/workspace/llm4binary/github/license_c_cmakelists/ValveSoftware[P]Fossilize/cli/SPIRV-Tools/source/val/validate_image.cpp"
                                    ,499,
                                    "spv_result_t spvtools::val::(anonymous namespace)::ValidateImageOperands(ValidationState_t &, const Instruction *, const ImageTypeInfo &, uint32_t)"
                                   );
                    }
                    if (local_238._M_dataplus._M_p == (char *)0x4) {
                      uVar10 = (pIVar15->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[2];
                      bVar5 = ValidationState_t::IsIntVectorType(_,uVar10);
                      if ((bVar5) &&
                         (uVar10 = ValidationState_t::GetDimension(_,uVar10), uVar10 == 2)) {
                        OVar11 = ValidationState_t::GetIdOpcode(_,uVar9);
                        iVar12 = spvOpcodeIsConstant(OVar11);
                        if (iVar12 != 0) {
                          word_index = word_index + 1;
                          goto LAB_001e7c98;
                        }
                        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                        pcVar21 = "Expected Image Operand ConstOffsets to be a const object";
                        lVar20 = 0x38;
                      }
                      else {
                        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                        pcVar21 = 
                        "Expected Image Operand ConstOffsets array components to be int vectors of size 2"
                        ;
                        lVar20 = 0x50;
                      }
                      goto LAB_001e7921;
                    }
                  }
                  ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                  pcVar21 = "Expected Image Operand ConstOffsets to be an array of size 4";
                  goto LAB_001e7c4e;
                }
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                pcVar21 = "Image Operand ConstOffsets cannot be used with Cube Image \'Dim\'";
                lVar20 = 0x3f;
              }
              else {
                ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
                pcVar21 = 
                "Image Operand ConstOffsets can only be used with OpImageGather and OpImageDrefGather"
                ;
                lVar20 = 0x54;
              }
              goto LAB_001e7921;
            }
            if (info->dim == Cube) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar21 = "Image Operand ConstOffset cannot be used with Cube Image \'Dim\'";
              goto LAB_001e78da;
            }
            uVar9 = (inst->words_).super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                    _M_impl.super__Vector_impl_data._M_start[word_index];
            uVar10 = ValidationState_t::GetTypeId(_,uVar9);
            bVar5 = ValidationState_t::IsIntScalarOrVectorType(_,uVar10);
            if (!bVar5) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar21 = "Expected Image Operand ConstOffset to be int scalar or ";
              lVar20 = 0x37;
LAB_001e80af:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,pcVar21,lVar20);
              pcVar21 = "vector";
              lVar20 = 6;
              goto LAB_001e7921;
            }
            OVar11 = ValidationState_t::GetIdOpcode(_,uVar9);
            iVar12 = spvOpcodeIsConstant(OVar11);
            if (iVar12 == 0) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar21 = "Expected Image Operand ConstOffset to be a const object";
              lVar20 = 0x37;
              goto LAB_001e7921;
            }
            uVar9 = GetPlaneCoordSize((ImageTypeInfo *)(ulong)info->dim);
            uVar10 = ValidationState_t::GetDimension(_,uVar10);
            if (uVar9 == uVar10) {
              word_index = word_index + 1;
              goto LAB_001e7c84;
            }
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,"Expected Image Operand ConstOffset to have ",0x2b);
LAB_001e83cd:
            std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208," components, but given ",0x17);
          }
          else {
            if (!bVar4) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar21 = "Image Operand Grad can only be used with ExplicitLod opcodes";
              goto LAB_001e7c4e;
            }
            uVar9 = ValidationState_t::GetTypeId
                              (_,(inst->words_).
                                 super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                 _M_impl.super__Vector_impl_data._M_start[word_index]);
            uVar10 = ValidationState_t::GetTypeId
                               (_,(inst->words_).
                                  super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                  _M_impl.super__Vector_impl_data._M_start[word_index + 1]);
            bVar4 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar9);
            if ((!bVar4) || (bVar4 = ValidationState_t::IsFloatScalarOrVectorType(_,uVar10), !bVar4)
               ) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,
                         "Expected both Image Operand Grad ids to be float scalars or ",0x3c);
              pcVar21 = "vectors";
              lVar20 = 7;
              goto LAB_001e7921;
            }
            uVar8 = GetPlaneCoordSize((ImageTypeInfo *)(ulong)info->dim);
            uVar9 = ValidationState_t::GetDimension(_,uVar9);
            uVar10 = ValidationState_t::GetDimension(_,uVar10);
            if (uVar8 == uVar9) {
              if (uVar8 == uVar10) {
                word_index = word_index + 2;
                bVar4 = true;
                goto LAB_001e7c7a;
              }
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              pcVar21 = "Expected Image Operand Grad dy to have ";
              lVar20 = 0x27;
LAB_001e83c1:
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,pcVar21,lVar20);
              goto LAB_001e83cd;
            }
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208,"Expected Image Operand Grad dx to have ",0x27);
            std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&local_208," components, but given ",0x17);
          }
          std::ostream::_M_insert<unsigned_long>((ulong)&local_208);
          goto LAB_001e7933;
        }
        if ((((bVar5 == false) && (uVar1 != 0x5f)) && (uVar1 != 0x139)) && (bVar6 == false)) {
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&local_208,
                     "Image Operand Lod can only be used with ExplicitLod opcodes ",0x3c);
          pcVar21 = "and OpImageFetch";
LAB_001e805b:
          lVar20 = 0x10;
        }
        else {
          if ((uVar22 & 4) != 0) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar21 = "Image Operand bits Lod and Grad cannot be set at the same time";
            goto LAB_001e78da;
          }
          uVar9 = ValidationState_t::GetTypeId
                            (_,(inst->words_).
                               super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                               _M_impl.super__Vector_impl_data._M_start[word_index]);
          if ((bVar4 | bVar6) == 1) {
            bVar4 = ValidationState_t::IsFloatScalarType(_,uVar9);
            if (!bVar4) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,
                         "Expected Image Operand Lod to be float scalar when used ",0x38);
              pcVar21 = "with ExplicitLod";
              goto LAB_001e805b;
            }
          }
          else {
            bVar4 = ValidationState_t::IsIntScalarType(_,uVar9);
            if (!bVar4) {
              ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
              std::__ostream_insert<char,std::char_traits<char>>
                        ((ostream *)&local_208,
                         "Expected Image Operand Lod to be int scalar when used with ",0x3b);
              pcVar21 = "OpImageFetch";
              lVar20 = 0xc;
              goto LAB_001e7921;
            }
          }
          if (info->dim < Rect) {
            word_index = word_index + 1;
            bVar4 = false;
            goto LAB_001e7c7a;
          }
          ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
          pcVar21 = "Image Operand Lod requires \'Dim\' parameter to be 1D, 2D, 3D or Cube";
          lVar20 = 0x43;
        }
      }
      else if (bVar3 || bVar6 != false) {
        uVar9 = ValidationState_t::GetTypeId
                          (_,(inst->words_).
                             super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                             .super__Vector_impl_data._M_start[word_index]);
        bVar7 = ValidationState_t::IsFloatScalarType(_,uVar9);
        if (bVar7) {
          if (Cube < info->dim) {
            ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
            pcVar21 = "Image Operand Bias requires \'Dim\' parameter to be 1D, 2D, 3D or Cube";
            lVar20 = 0x44;
            goto LAB_001e7921;
          }
          word_index = word_index + 1;
          goto LAB_001e7a16;
        }
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar21 = "Expected Image Operand Bias to be float scalar";
LAB_001e7c25:
        lVar20 = 0x2e;
      }
      else {
        ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
        pcVar21 = "Image Operand Bias can only be used with ImplicitLod opcodes";
LAB_001e7c4e:
        lVar20 = 0x3c;
      }
    }
    else {
      ValidationState_t::diag(&local_208,_,SPV_ERROR_INVALID_DATA,inst);
      pcVar21 = "Image Operand Sample is required for operation on multi-sampled image";
      lVar20 = 0x45;
    }
  }
LAB_001e7921:
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)&local_208,pcVar21,lVar20);
LAB_001e7933:
  DiagnosticStream::~DiagnosticStream(&local_208);
  return local_208.error_;
}

Assistant:

spv_result_t ValidateImageOperands(ValidationState_t& _,
                                   const Instruction* inst,
                                   const ImageTypeInfo& info,
                                   uint32_t word_index) {
  static const bool kAllImageOperandsHandled = CheckAllImageOperandsHandled();
  (void)kAllImageOperandsHandled;

  const spv::Op opcode = inst->opcode();
  const size_t num_words = inst->words().size();

  const bool have_explicit_mask = (word_index - 1 < num_words);
  const uint32_t mask = have_explicit_mask ? inst->word(word_index - 1) : 0u;

  if (have_explicit_mask) {
    // NonPrivate, Volatile, SignExtend, ZeroExtend take no operand words.
    const uint32_t mask_bits_having_operands =
        mask & ~uint32_t(spv::ImageOperandsMask::NonPrivateTexelKHR |
                         spv::ImageOperandsMask::VolatileTexelKHR |
                         spv::ImageOperandsMask::SignExtend |
                         spv::ImageOperandsMask::ZeroExtend |
                         spv::ImageOperandsMask::Nontemporal);
    size_t expected_num_image_operand_words =
        spvtools::utils::CountSetBits(mask_bits_having_operands);
    if (mask & uint32_t(spv::ImageOperandsMask::Grad)) {
      // Grad uses two words.
      ++expected_num_image_operand_words;
    }

    if (expected_num_image_operand_words != num_words - word_index) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Number of image operand ids doesn't correspond to the bit "
                "mask";
    }
  } else if (num_words != word_index - 1) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Number of image operand ids doesn't correspond to the bit mask";
  }

  if (info.multisampled &
      (0 == (mask & uint32_t(spv::ImageOperandsMask::Sample)))) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Image Operand Sample is required for operation on "
              "multi-sampled image";
  }

  // After this point, only set bits in the image operands mask can cause
  // the module to be invalid.
  if (mask == 0) return SPV_SUCCESS;

  if (spvtools::utils::CountSetBits(
          mask & uint32_t(spv::ImageOperandsMask::Offset |
                          spv::ImageOperandsMask::ConstOffset |
                          spv::ImageOperandsMask::ConstOffsets |
                          spv::ImageOperandsMask::Offsets)) > 1) {
    return _.diag(SPV_ERROR_INVALID_DATA, inst)
           << "Image Operands Offset, ConstOffset, ConstOffsets, Offsets "
              "cannot be used together";
  }

  const bool is_implicit_lod = IsImplicitLod(opcode);
  const bool is_explicit_lod = IsExplicitLod(opcode);
  const bool is_valid_lod_operand = IsValidLodOperand(_, opcode);
  const bool is_valid_gather_lod_bias_amd = IsValidGatherLodBiasAMD(_, opcode);

  // The checks should be done in the order of definition of OperandImage.

  if (mask & uint32_t(spv::ImageOperandsMask::Bias)) {
    if (!is_implicit_lod && !is_valid_gather_lod_bias_amd) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Bias can only be used with ImplicitLod opcodes";
    }

    const uint32_t type_id = _.GetTypeId(inst->word(word_index++));
    if (!_.IsFloatScalarType(type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Bias to be float scalar";
    }

    if (info.dim != spv::Dim::Dim1D && info.dim != spv::Dim::Dim2D &&
        info.dim != spv::Dim::Dim3D && info.dim != spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Bias requires 'Dim' parameter to be 1D, 2D, 3D "
                "or Cube";
    }

    // Multisampled is already checked.
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Lod)) {
    if (!is_valid_lod_operand && opcode != spv::Op::OpImageFetch &&
        opcode != spv::Op::OpImageSparseFetch &&
        !is_valid_gather_lod_bias_amd) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Lod can only be used with ExplicitLod opcodes "
             << "and OpImageFetch";
    }

    if (mask & uint32_t(spv::ImageOperandsMask::Grad)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand bits Lod and Grad cannot be set at the same "
                "time";
    }

    const uint32_t type_id = _.GetTypeId(inst->word(word_index++));
    if (is_explicit_lod || is_valid_gather_lod_bias_amd) {
      if (!_.IsFloatScalarType(type_id)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected Image Operand Lod to be float scalar when used "
               << "with ExplicitLod";
      }
    } else {
      if (!_.IsIntScalarType(type_id)) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << "Expected Image Operand Lod to be int scalar when used with "
               << "OpImageFetch";
      }
    }

    if (info.dim != spv::Dim::Dim1D && info.dim != spv::Dim::Dim2D &&
        info.dim != spv::Dim::Dim3D && info.dim != spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Lod requires 'Dim' parameter to be 1D, 2D, 3D "
                "or Cube";
    }

    // Multisampled is already checked.
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Grad)) {
    if (!is_explicit_lod) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Grad can only be used with ExplicitLod opcodes";
    }

    const uint32_t dx_type_id = _.GetTypeId(inst->word(word_index++));
    const uint32_t dy_type_id = _.GetTypeId(inst->word(word_index++));
    if (!_.IsFloatScalarOrVectorType(dx_type_id) ||
        !_.IsFloatScalarOrVectorType(dy_type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected both Image Operand Grad ids to be float scalars or "
             << "vectors";
    }

    const uint32_t plane_size = GetPlaneCoordSize(info);
    const uint32_t dx_size = _.GetDimension(dx_type_id);
    const uint32_t dy_size = _.GetDimension(dy_type_id);
    if (plane_size != dx_size) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Grad dx to have " << plane_size
             << " components, but given " << dx_size;
    }

    if (plane_size != dy_size) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Grad dy to have " << plane_size
             << " components, but given " << dy_size;
    }

    // Multisampled is already checked.
  }

  if (mask & uint32_t(spv::ImageOperandsMask::ConstOffset)) {
    if (info.dim == spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand ConstOffset cannot be used with Cube Image "
                "'Dim'";
    }

    const uint32_t id = inst->word(word_index++);
    const uint32_t type_id = _.GetTypeId(id);
    if (!_.IsIntScalarOrVectorType(type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffset to be int scalar or "
             << "vector";
    }

    if (!spvOpcodeIsConstant(_.GetIdOpcode(id))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffset to be a const object";
    }

    const uint32_t plane_size = GetPlaneCoordSize(info);
    const uint32_t offset_size = _.GetDimension(type_id);
    if (plane_size != offset_size) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffset to have " << plane_size
             << " components, but given " << offset_size;
    }
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Offset)) {
    if (info.dim == spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Offset cannot be used with Cube Image 'Dim'";
    }

    const uint32_t id = inst->word(word_index++);
    const uint32_t type_id = _.GetTypeId(id);
    if (!_.IsIntScalarOrVectorType(type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Offset to be int scalar or "
             << "vector";
    }

    const uint32_t plane_size = GetPlaneCoordSize(info);
    const uint32_t offset_size = _.GetDimension(type_id);
    if (plane_size != offset_size) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Offset to have " << plane_size
             << " components, but given " << offset_size;
    }

    if (!_.options()->before_hlsl_legalization &&
        spvIsVulkanEnv(_.context()->target_env)) {
      if (opcode != spv::Op::OpImageGather &&
          opcode != spv::Op::OpImageDrefGather &&
          opcode != spv::Op::OpImageSparseGather &&
          opcode != spv::Op::OpImageSparseDrefGather) {
        return _.diag(SPV_ERROR_INVALID_DATA, inst)
               << _.VkErrorID(4663)
               << "Image Operand Offset can only be used with "
                  "OpImage*Gather operations";
      }
    }
  }

  if (mask & uint32_t(spv::ImageOperandsMask::ConstOffsets)) {
    if (opcode != spv::Op::OpImageGather &&
        opcode != spv::Op::OpImageDrefGather &&
        opcode != spv::Op::OpImageSparseGather &&
        opcode != spv::Op::OpImageSparseDrefGather) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand ConstOffsets can only be used with "
                "OpImageGather and OpImageDrefGather";
    }

    if (info.dim == spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand ConstOffsets cannot be used with Cube Image "
                "'Dim'";
    }

    const uint32_t id = inst->word(word_index++);
    const uint32_t type_id = _.GetTypeId(id);
    const Instruction* type_inst = _.FindDef(type_id);
    assert(type_inst);

    if (type_inst->opcode() != spv::Op::OpTypeArray) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffsets to be an array of size 4";
    }

    uint64_t array_size = 0;
    if (!_.EvalConstantValUint64(type_inst->word(3), &array_size)) {
      assert(0 && "Array type definition is corrupt");
    }

    if (array_size != 4) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffsets to be an array of size 4";
    }

    const uint32_t component_type = type_inst->word(2);
    if (!_.IsIntVectorType(component_type) ||
        _.GetDimension(component_type) != 2) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffsets array components to be "
                "int vectors of size 2";
    }

    if (!spvOpcodeIsConstant(_.GetIdOpcode(id))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand ConstOffsets to be a const object";
    }
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Sample)) {
    if (opcode != spv::Op::OpImageFetch && opcode != spv::Op::OpImageRead &&
        opcode != spv::Op::OpImageWrite &&
        opcode != spv::Op::OpImageSparseFetch &&
        opcode != spv::Op::OpImageSparseRead) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Sample can only be used with OpImageFetch, "
             << "OpImageRead, OpImageWrite, OpImageSparseFetch and "
             << "OpImageSparseRead";
    }

    if (info.multisampled == 0) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand Sample requires non-zero 'MS' parameter";
    }

    const uint32_t type_id = _.GetTypeId(inst->word(word_index++));
    if (!_.IsIntScalarType(type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand Sample to be int scalar";
    }
  }

  if (mask & uint32_t(spv::ImageOperandsMask::MinLod)) {
    if (!is_implicit_lod && !(mask & uint32_t(spv::ImageOperandsMask::Grad))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MinLod can only be used with ImplicitLod "
             << "opcodes or together with Image Operand Grad";
    }

    const uint32_t type_id = _.GetTypeId(inst->word(word_index++));
    if (!_.IsFloatScalarType(type_id)) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Expected Image Operand MinLod to be float scalar";
    }

    if (info.dim != spv::Dim::Dim1D && info.dim != spv::Dim::Dim2D &&
        info.dim != spv::Dim::Dim3D && info.dim != spv::Dim::Cube) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MinLod requires 'Dim' parameter to be 1D, 2D, "
                "3D or Cube";
    }

    if (info.multisampled != 0) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MinLod requires 'MS' parameter to be 0";
    }
  }

  if (mask & uint32_t(spv::ImageOperandsMask::MakeTexelAvailableKHR)) {
    // Checked elsewhere: capability and memory model are correct.
    if (opcode != spv::Op::OpImageWrite) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MakeTexelAvailableKHR can only be used with Op"
             << spvOpcodeString(spv::Op::OpImageWrite) << ": Op"
             << spvOpcodeString(opcode);
    }

    if (!(mask & uint32_t(spv::ImageOperandsMask::NonPrivateTexelKHR))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MakeTexelAvailableKHR requires "
                "NonPrivateTexelKHR is also specified: Op"
             << spvOpcodeString(opcode);
    }

    const auto available_scope = inst->word(word_index++);
    if (auto error = ValidateMemoryScope(_, inst, available_scope))
      return error;
  }

  if (mask & uint32_t(spv::ImageOperandsMask::MakeTexelVisibleKHR)) {
    // Checked elsewhere: capability and memory model are correct.
    if (opcode != spv::Op::OpImageRead &&
        opcode != spv::Op::OpImageSparseRead) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MakeTexelVisibleKHR can only be used with Op"
             << spvOpcodeString(spv::Op::OpImageRead) << " or Op"
             << spvOpcodeString(spv::Op::OpImageSparseRead) << ": Op"
             << spvOpcodeString(opcode);
    }

    if (!(mask & uint32_t(spv::ImageOperandsMask::NonPrivateTexelKHR))) {
      return _.diag(SPV_ERROR_INVALID_DATA, inst)
             << "Image Operand MakeTexelVisibleKHR requires NonPrivateTexelKHR "
                "is also specified: Op"
             << spvOpcodeString(opcode);
    }

    const auto visible_scope = inst->word(word_index++);
    if (auto error = ValidateMemoryScope(_, inst, visible_scope)) return error;
  }

  if (mask & uint32_t(spv::ImageOperandsMask::SignExtend)) {
    // Checked elsewhere: SPIR-V 1.4 version or later.

    // "The texel value is converted to the target value via sign extension.
    // Only valid when the texel type is a scalar or vector of integer type."
    //
    // We don't have enough information to know what the texel type is.
    // In OpenCL, knowledge is deferred until runtime: the image SampledType is
    // void, and the Format is Unknown.
    // In Vulkan, the texel type is only known in all cases by the pipeline
    // setup.
  }

  if (mask & uint32_t(spv::ImageOperandsMask::ZeroExtend)) {
    // Checked elsewhere: SPIR-V 1.4 version or later.

    // "The texel value is converted to the target value via zero extension.
    // Only valid when the texel type is a scalar or vector of integer type."
    //
    // We don't have enough information to know what the texel type is.
    // In OpenCL, knowledge is deferred until runtime: the image SampledType is
    // void, and the Format is Unknown.
    // In Vulkan, the texel type is only known in all cases by the pipeline
    // setup.
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Offsets)) {
    // TODO: add validation
  }

  if (mask & uint32_t(spv::ImageOperandsMask::Nontemporal)) {
    // Checked elsewhere: SPIR-V 1.6 version or later.
  }

  return SPV_SUCCESS;
}